

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.hpp
# Opt level: O0

shared_ptr<ghc::options::option_info> __thiscall
ghc::options::create_option
          (options *this,string *option,string *description,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *handler)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  element_type *peVar4;
  element_type *__x;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<ghc::options::option_info> sVar5;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58;
  undefined1 local_34 [8];
  type type;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *handler_local;
  string *description_local;
  string *option_local;
  options *this_local;
  shared_ptr<ghc::options::option_info> *optinfo;
  
  local_34._0_4_ = 0;
  handler_local = handler;
  description_local = description;
  option_local = option;
  this_local = this;
  uVar2 = std::__cxx11::string::length();
  if (2 < uVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,anon_var_dwarf_389f0 + 0x38fc,&local_59);
    bVar1 = ends_with(description,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    if (bVar1) {
      lVar3 = std::__cxx11::string::length();
      std::__cxx11::string::erase((ulong)description,lVar3 - 1);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"?",&local_91);
      bVar1 = ends_with(description,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
      if (bVar1) {
        local_34._0_4_ = 1;
        lVar3 = std::__cxx11::string::length();
        std::__cxx11::string::erase((ulong)description,lVar3 - 1);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"!",&local_b9);
        bVar1 = ends_with(description,&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::allocator<char>::~allocator(&local_b9);
        if (bVar1) {
          local_34._0_4_ = 2;
          lVar3 = std::__cxx11::string::length();
          std::__cxx11::string::erase((ulong)description,lVar3 - 1);
        }
      }
    }
  }
  std::
  make_shared<ghc::options::option_info,std::__cxx11::string&,std::__cxx11::string_const&,ghc::options::option_info::type&,std::function<void(std::__cxx11::string_const&)>&>
            (&this->_arg0,description,(type *)handler_local,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)local_34);
  peVar4 = std::
           __shared_ptr_access<ghc::options::option_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ghc::options::option_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::weak_ptr<ghc::options::option_info>::operator=
            (&peVar4->_master,(shared_ptr<ghc::options::option_info> *)this);
  peVar4 = std::
           __shared_ptr_access<ghc::options::option_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ghc::options::option_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  __x = std::
        __shared_ptr_access<ghc::options::option_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<ghc::options::option_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&peVar4->_variants,&__x->_name);
  sVar5.super___shared_ptr<ghc::options::option_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar5.super___shared_ptr<ghc::options::option_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<ghc::options::option_info>)
         sVar5.super___shared_ptr<ghc::options::option_info,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<option_info> create_option(std::string option, const std::string& description, std::function<void(const std::string&)> handler) const
    {
        option_info::type type = option_info::type::no_arg;
        if (option.length() > 2) {
            if (ends_with(option, " ")) {
                option.erase(option.length()-1);
            }
            else if (ends_with(option, "?")) {
                type = option_info::type::arg_optional;
                option.erase(option.length()-1);
            }
            else if (ends_with(option, "!")) {
                type = option_info::type::arg_needed;
                option.erase(option.length()-1);
            }
        }
        auto optinfo = std::make_shared<option_info>(option, description, type, handler);
        optinfo->_master = optinfo;
        optinfo->_variants.push_back(optinfo->_name);
        return optinfo;
    }